

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::emitCommentFuncHeader(PrintC *this,Funcdata *fd)

{
  CommentSorter *this_00;
  Address *fad;
  bool bVar1;
  Comment *pCVar2;
  allocator local_a9;
  Funcdata *local_a8;
  string local_a0;
  Comment label;
  
  this_00 = &this->commsorter;
  bVar1 = false;
  CommentSorter::setupHeader(this_00,0);
  while ((this->commsorter).start._M_node != (this->commsorter).opstop._M_node) {
    pCVar2 = CommentSorter::getNext(this_00);
    if (((this->super_PrintLanguage).head_comment_type & pCVar2->type) != 0) {
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,pCVar2);
      bVar1 = true;
    }
  }
  if (this->option_unplaced == true) {
    if (bVar1) {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    }
    CommentSorter::setupHeader(this_00,1);
    fad = &fd->baseaddr;
    bVar1 = false;
    local_a8 = fd;
    while (fd = local_a8, (this->commsorter).start._M_node != (this->commsorter).opstop._M_node) {
      pCVar2 = CommentSorter::getNext(this_00);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)&local_a0,"Comments that could not be placed in the function body:",
                   &local_a9);
        Comment::Comment(&label,0x20,fad,fad,0,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,&label);
        std::__cxx11::string::~string((string *)&label.text);
        bVar1 = true;
      }
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,1,pCVar2);
    }
  }
  if ((this->super_PrintLanguage).field_0xff == '\x01') {
    if (bVar1) {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    }
    std::__cxx11::string::string
              ((string *)&local_a0,"DISPLAY WARNING: Type casts are NOT being printed",&local_a9);
    Comment::Comment(&label,0x20,&fd->baseaddr,&fd->baseaddr,0,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,&label);
    std::__cxx11::string::~string((string *)&label.text);
  }
  else if (!bVar1) {
    return;
  }
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  return;
}

Assistant:

void PrintC::emitCommentFuncHeader(const Funcdata *fd)

{
  bool extralinebreak = false;
  commsorter.setupHeader(CommentSorter::header_basic);
  while(commsorter.hasNext()) {
    Comment *comm = commsorter.getNext();
    if ((head_comment_type & comm->getType())==0) continue;
    emitLineComment(0,comm);
    extralinebreak = true;
  }
  if (option_unplaced) {
    if (extralinebreak)
      emit->tagLine();
    extralinebreak = false;
    commsorter.setupHeader(CommentSorter::header_unplaced);
    while(commsorter.hasNext()) {
      Comment *comm = commsorter.getNext();
      if (!extralinebreak) {
	Comment label(Comment::warningheader,fd->getAddress(),fd->getAddress(),0,
		      "Comments that could not be placed in the function body:");
	emitLineComment(0,&label);
	extralinebreak = true;
      }
      emitLineComment(1,comm);
    }
  }
  if (option_nocasts) {
    if (extralinebreak)
      emit->tagLine();
    Comment comm(Comment::warningheader,fd->getAddress(),fd->getAddress(),0,
		 "DISPLAY WARNING: Type casts are NOT being printed");
    emitLineComment(0,&comm);
    extralinebreak = true;
  }
  if (extralinebreak)
    emit->tagLine();		// Extra linebreak if comment exists
}